

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Own<capnp::PipelineHook>_>::truncate
          (ArrayBuilder<kj::Own<capnp::PipelineHook>_> *this,char *__file,__off_t __length)

{
  Own<capnp::PipelineHook> *pOVar1;
  Own<capnp::PipelineHook> *pOVar2;
  PipelineHook *pPVar3;
  
  pOVar1 = this->ptr;
  pOVar2 = this->pos;
  while (pOVar1 + (long)__file < pOVar2) {
    this->pos = pOVar2 + -1;
    pPVar3 = pOVar2[-1].ptr;
    if (pPVar3 != (PipelineHook *)0x0) {
      pOVar2[-1].ptr = (PipelineHook *)0x0;
      (**(pOVar2[-1].disposer)->_vptr_Disposer)
                (pOVar2[-1].disposer,
                 pPVar3->_vptr_PipelineHook[-2] + (long)&pPVar3->_vptr_PipelineHook);
    }
    pOVar2 = this->pos;
  }
  return (int)pOVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }